

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::anon_unknown_0::MessageContainsEnums
               (Descriptor *message)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Descriptor *in_RDI;
  int i;
  int index;
  bool local_1;
  
  iVar2 = Descriptor::enum_type_count(in_RDI);
  if (iVar2 < 1) {
    iVar2 = 0;
    while (index = iVar2, iVar3 = Descriptor::nested_type_count(in_RDI), iVar2 < iVar3) {
      Descriptor::nested_type(in_RDI,index);
      bVar1 = MessageContainsEnums((Descriptor *)CONCAT44(index,iVar2));
      if (bVar1) {
        return true;
      }
      iVar2 = index + 1;
    }
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MessageContainsEnums(const Descriptor* message) {
  if (message->enum_type_count() > 0) {
    return true;
  }
  for (int i = 0; i < message->nested_type_count(); i++) {
    if (MessageContainsEnums(message->nested_type(i))) {
      return true;
    }
  }
  return false;
}